

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O3

void __thiscall CSocekt::clearconnection(CSocekt *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *point;
  CMemory *this_00;
  
  this_00 = CMemory::GetInstance();
  p_Var2 = (this->m_connectionList).
           super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->m_connectionList) {
    point = p_Var2[1]._M_next;
    psVar1 = &(this->m_connectionList).
              super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2);
    (**(code **)point->_M_next)(point);
    CMemory::FreeMemory(this_00,point);
    p_Var2 = (this->m_connectionList).
             super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
  }
  return;
}

Assistant:

void CSocekt::clearconnection()
{
    lp_connection_t p_Conn;
	CMemory *p_memory = CMemory::GetInstance(); //获得单例对象的指针
	
	while(!m_connectionList.empty())
	{
		p_Conn = m_connectionList.front();
		m_connectionList.pop_front(); 
        p_Conn->~flyd_connection_t();     //手工调用析构函数
		p_memory->FreeMemory(p_Conn);
	}
}